

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<std::complex<long_double>_>::Compare
          (TPZMatrix<std::complex<long_double>_> *this,TPZSavable *copy,bool override)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  stringstream sout;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if (copy == (TPZSavable *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(copy,&TPZSavable::typeinfo,
                           &TPZMatrix<std::complex<long_double>>::typeinfo,0);
  }
  if (lVar2 == 0) {
    bVar1 = false;
  }
  else {
    if ((((this->super_TPZBaseMatrix).fRow != *(long *)(lVar2 + 8)) ||
        ((this->super_TPZBaseMatrix).fCol != *(long *)(lVar2 + 0x10))) ||
       (bVar1 = true, (this->super_TPZBaseMatrix).fDecomposed != *(char *)(lVar2 + 0x18))) {
      bVar1 = false;
    }
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_190,
                 "virtual bool TPZMatrix<std::complex<long double>>::Compare(TPZSavable *, bool) const [T = std::complex<long double>]"
                 ,0x74);
      std::__ostream_insert<char,std::char_traits<char>>(local_190," did not compare ",0x11);
      std::__cxx11::stringbuf::str();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_1c0,local_1b8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1a0);
      std::ios_base::~ios_base(local_120);
    }
    if (override && !bVar1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
                 ,0x4c5);
    }
  }
  return bVar1;
}

Assistant:

bool TPZMatrix<TVar>::Compare(TPZSavable *copy, bool override) const
{
	TPZMatrix<TVar> *copmat = dynamic_cast<TPZMatrix<TVar> *> (copy);
	if(!copmat) return false;
	bool result = true;
	if(fRow != copmat->fRow || fCol != copmat->fCol || fDecomposed != copmat->fDecomposed) result = false;
	if(!result)
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " did not compare ";
		LOGPZ_ERROR(loggerCheck,sout.str())
	}
	if(override && !result)
	{
		DebugStop();
	}
	return result;
}